

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Walk.cpp
# Opt level: O1

void Handlers::walk_common(Character *character,PacketReader *reader,offset_in_Character_to_subr f)

{
  int iVar1;
  World *pWVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  mapped_type *this;
  int iVar9;
  PacketBuilder builder;
  undefined1 local_60 [48];
  
  bVar3 = PacketReader::GetChar(reader);
  uVar7 = PacketReader::GetThree(reader);
  uVar4 = PacketReader::GetChar(reader);
  uVar5 = PacketReader::GetChar(reader);
  pWVar2 = character->world;
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"EnforceTimestamps","");
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar2->config,(key_type *)local_60);
  bVar6 = util::variant::GetBool(this);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  iVar9 = (int)uVar7 % 0x83d600;
  if (bVar6) {
    iVar1 = (character->timestamp).ts;
    iVar8 = iVar1;
    if (((iVar9 != -1) && (iVar8 = iVar9, iVar1 != -1)) && (iVar8 = iVar9 - iVar1, iVar9 < iVar1)) {
      iVar8 = (iVar9 - iVar1) + 0x83d600;
    }
    if (iVar8 < 0x24) {
      return;
    }
  }
  (character->timestamp).ts = iVar9;
  if (character->sitting == SIT_STAND) {
    iVar9 = 0;
    if (bVar3 < 4) {
      character->npc = (NPC *)0x0;
      character->npc_type = NPC;
      character->board = (Board *)0x0;
      character->jukebox_open = false;
      if (character->trading == true) {
        PacketBuilder::PacketBuilder((PacketBuilder *)local_60,PACKET_TRADE,PACKET_CLOSE,2);
        iVar9 = Character::PlayerID(character);
        PacketBuilder::AddShort((PacketBuilder *)local_60,iVar9);
        Character::Send(character->trade_partner,(PacketBuilder *)local_60);
        character->trading = false;
        std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                  (&character->trade_inventory);
        character->trade_agree = false;
        character->trade_partner->trading = false;
        std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                  (&character->trade_partner->trade_inventory);
        character->trade_agree = false;
        Character::CheckQuestRules(character);
        Character::CheckQuestRules(character->trade_partner);
        character->trade_partner->trade_partner = (Character *)0x0;
        character->trade_partner = (Character *)0x0;
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
      }
      if ((f & 1) != 0) {
        f = *(undefined8 *)((long)(character->super_Command_Source)._vptr_Command_Source + (f - 1));
      }
      iVar9 = (*(code *)f)(character,bVar3);
    }
    if ((iVar9 == 0) || ((iVar9 == 1 && ((character->x != uVar4 || (character->y != uVar5)))))) {
      Character::Refresh(character);
    }
  }
  return;
}

Assistant:

static void walk_common(Character *character, PacketReader &reader, Map::WalkResult (Character::*f)(Direction))
{
	Direction direction = static_cast<Direction>(reader.GetChar());
	Timestamp timestamp = reader.GetThree();
	unsigned char x = reader.GetChar();
	unsigned char y = reader.GetChar();
	Map::WalkResult walk_result = Map::WalkFail;

	if (character->world->config["EnforceTimestamps"])
	{
		if (timestamp - character->timestamp < 36)
		{
			return;
		}
	}

	character->timestamp = timestamp;

	if (character->sitting != SIT_STAND)
	{
		return;
	}

	if (direction <= 3)
	{
		character->npc = 0;
		character->npc_type = ENF::NPC;
		character->board = 0;
		character->jukebox_open = false;

		if (character->trading)
		{
			PacketBuilder builder(PACKET_TRADE, PACKET_CLOSE, 2);
			builder.AddShort(character->PlayerID());
			character->trade_partner->Send(builder);

			character->trading = false;
			character->trade_inventory.clear();
			character->trade_agree = false;

			character->trade_partner->trading = false;
			character->trade_partner->trade_inventory.clear();
			character->trade_agree = false;

			character->CheckQuestRules();
			character->trade_partner->CheckQuestRules();

			character->trade_partner->trade_partner = 0;
			character->trade_partner = 0;
		}

		walk_result = (character->*f)(direction);
	}

	if (walk_result == Map::WalkFail || (walk_result == Map::WalkOK && (character->x != x || character->y != y)))
	{
		character->Refresh();
	}
}